

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O1

SourceLocation __thiscall slang::parsing::ParserBase::getLastLocation(ParserBase *this)

{
  SourceLocation SVar1;
  Token *this_00;
  string_view sVar2;
  Token local_20;
  
  if ((this->window).lastConsumed.info == (Info *)0x0) {
    local_20 = peek(this);
    SVar1 = Token::location(&local_20);
  }
  else {
    this_00 = &(this->window).lastConsumed;
    SVar1 = Token::location(this_00);
    sVar2 = Token::rawText(this_00);
    SVar1 = (SourceLocation)(sVar2._M_len * 0x10000000 + (long)SVar1);
  }
  return SVar1;
}

Assistant:

SourceLocation ParserBase::getLastLocation() {
    if (window.lastConsumed)
        return window.lastConsumed.location() + window.lastConsumed.rawText().length();

    return peek().location();
}